

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O1

void Abc_NtkTraverseSupers(Abc_ShaMan_t *p,int fAnd)

{
  Abc_Ntk_t *pAVar1;
  Abc_Obj_t *pAVar2;
  uint *puVar3;
  uint uVar4;
  Vec_Ptr_t *vInputs;
  void **ppvVar5;
  int *piVar6;
  Vec_Ptr_t *pVVar7;
  undefined8 *puVar8;
  void *pvVar9;
  void *pvVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  
  pAVar1 = p->pNtk;
  lVar15 = ((long)fAnd + 1) * (long)pAVar1->vObjs->nSize;
  vInputs = (Vec_Ptr_t *)malloc(0x10);
  iVar13 = (int)lVar15;
  iVar14 = 8;
  if (6 < iVar13 - 1U) {
    iVar14 = iVar13;
  }
  vInputs->nSize = 0;
  vInputs->nCap = iVar14;
  if (iVar14 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((long)iVar14 << 3);
  }
  vInputs->pArray = ppvVar5;
  vInputs->nSize = iVar13;
  memset(ppvVar5,0,lVar15 * 8);
  if ((pAVar1->vTravIds).pArray == (int *)0x0) {
    iVar13 = pAVar1->vObjs->nSize;
    uVar12 = (long)iVar13 + 500;
    iVar14 = (int)uVar12;
    if ((pAVar1->vTravIds).nCap < iVar14) {
      piVar6 = (int *)malloc(uVar12 * 4);
      (pAVar1->vTravIds).pArray = piVar6;
      if (piVar6 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pAVar1->vTravIds).nCap = iVar14;
    }
    if (-500 < iVar13) {
      memset((pAVar1->vTravIds).pArray,0,(uVar12 & 0xffffffff) << 2);
    }
    (pAVar1->vTravIds).nSize = iVar14;
  }
  iVar13 = pAVar1->nTravIds;
  pAVar1->nTravIds = iVar13 + 1;
  if (0x3ffffffe < iVar13) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pVVar7 = p->pNtk->vCos;
  if (fAnd == 0) {
    if (0 < pVVar7->nSize) {
      lVar15 = 0;
      do {
        pAVar2 = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*pVVar7->pArray[lVar15] + 0x20) + 8) +
                  (long)**(int **)((long)pVVar7->pArray[lVar15] + 0x20) * 8);
        if ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7) {
          Abc_NtkTraverseSupersXor_rec(p,pAVar2,vInputs);
        }
        lVar15 = lVar15 + 1;
        pVVar7 = p->pNtk->vCos;
      } while (lVar15 < pVVar7->nSize);
    }
  }
  else if (0 < pVVar7->nSize) {
    lVar15 = 0;
    do {
      pAVar2 = *(Abc_Obj_t **)
                (*(long *)(*(long *)(*pVVar7->pArray[lVar15] + 0x20) + 8) +
                (long)**(int **)((long)pVVar7->pArray[lVar15] + 0x20) * 8);
      if ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7) {
        Abc_NtkTraverseSupersAnd_rec(p,pAVar2,vInputs);
      }
      lVar15 = lVar15 + 1;
      pVVar7 = p->pNtk->vCos;
    } while (lVar15 < pVVar7->nSize);
  }
  p->nStartCols = p->vObj2Lit->nSize;
  if ((long)vInputs->nSize < 1) {
    uVar4 = 0;
  }
  else {
    lVar15 = 0;
    uVar4 = 0;
    do {
      if ((vInputs->pArray[lVar15] != (void *)0x0) &&
         (uVar11 = *(int *)((long)vInputs->pArray[lVar15] + 4) - 2, (int)uVar4 <= (int)uVar11)) {
        uVar4 = uVar11;
      }
      lVar15 = lVar15 + 1;
    } while (vInputs->nSize != lVar15);
  }
  if (p->vBuckets != (Vec_Ptr_t *)0x0) {
    __assert_fail("p->vBuckets == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcExtract.c"
                  ,0x158,"void Abc_NtkTraverseSupers(Abc_ShaMan_t *, int)");
  }
  uVar11 = uVar4 + 1;
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  uVar12 = 8;
  if (6 < uVar4) {
    uVar12 = (ulong)uVar11;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = (int)uVar12;
  ppvVar5 = (void **)malloc(uVar12 << 3);
  pVVar7->pArray = ppvVar5;
  p->vBuckets = pVVar7;
  do {
    pVVar7 = p->vBuckets;
    puVar8 = (undefined8 *)malloc(0x10);
    *puVar8 = 10;
    pvVar9 = malloc(0x50);
    puVar8[1] = pvVar9;
    uVar4 = pVVar7->nCap;
    if (pVVar7->nSize == uVar4) {
      if ((int)uVar4 < 0x10) {
        if (pVVar7->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc(0x80);
        }
        else {
          ppvVar5 = (void **)realloc(pVVar7->pArray,0x80);
        }
        pVVar7->pArray = ppvVar5;
        iVar13 = 0x10;
      }
      else {
        iVar13 = uVar4 * 2;
        if (iVar13 <= (int)uVar4) goto LAB_00260c0e;
        if (pVVar7->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc((ulong)uVar4 << 4);
        }
        else {
          ppvVar5 = (void **)realloc(pVVar7->pArray,(ulong)uVar4 << 4);
        }
        pVVar7->pArray = ppvVar5;
      }
      pVVar7->nCap = iVar13;
    }
LAB_00260c0e:
    iVar13 = pVVar7->nSize;
    pVVar7->nSize = iVar13 + 1;
    pVVar7->pArray[iVar13] = puVar8;
    uVar11 = uVar11 - 1;
  } while (uVar11 != 0);
  if (0 < vInputs->nSize) {
    lVar15 = 0;
    do {
      pvVar9 = vInputs->pArray[lVar15];
      if (pvVar9 != (void *)0x0) {
        if (*(int *)((long)pvVar9 + 4) < 2) {
LAB_00260d2b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        uVar4 = *(int *)((long)pvVar9 + 4) - 2;
        if (p->vBuckets->nSize <= (int)uVar4) goto LAB_00260d2b;
        puVar3 = (uint *)p->vBuckets->pArray[uVar4];
        uVar4 = *puVar3;
        if (puVar3[1] == uVar4) {
          if ((int)uVar4 < 0x10) {
            if (*(void **)(puVar3 + 2) == (void *)0x0) {
              pvVar10 = malloc(0x80);
            }
            else {
              pvVar10 = realloc(*(void **)(puVar3 + 2),0x80);
            }
            *(void **)(puVar3 + 2) = pvVar10;
            uVar11 = 0x10;
          }
          else {
            uVar11 = uVar4 * 2;
            if ((int)uVar11 <= (int)uVar4) goto LAB_00260cdc;
            if (*(void **)(puVar3 + 2) == (void *)0x0) {
              pvVar10 = malloc((ulong)uVar4 << 4);
            }
            else {
              pvVar10 = realloc(*(void **)(puVar3 + 2),(ulong)uVar4 << 4);
            }
            *(void **)(puVar3 + 2) = pvVar10;
          }
          *puVar3 = uVar11;
        }
LAB_00260cdc:
        uVar4 = puVar3[1];
        puVar3[1] = uVar4 + 1;
        *(void **)(*(long *)(puVar3 + 2) + (long)(int)uVar4 * 8) = pvVar9;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < vInputs->nSize);
  }
  if (vInputs->pArray != (void **)0x0) {
    free(vInputs->pArray);
    vInputs->pArray = (void **)0x0;
  }
  free(vInputs);
  return;
}

Assistant:

void Abc_NtkTraverseSupers( Abc_ShaMan_t * p, int fAnd )
{
    Vec_Ptr_t * vInputs;
    Vec_Int_t * vInput;
    Abc_Obj_t * pObj;
    int i, nOnesMax;

    // create mapping of nodes into their column vectors
    vInputs = Vec_PtrStart( Abc_NtkObjNumMax(p->pNtk) * (1 + fAnd) );
    Abc_NtkIncrementTravId( p->pNtk );
    if ( fAnd )
    {
        Abc_NtkForEachCo( p->pNtk, pObj, i )
            if ( Abc_ObjIsNode(Abc_ObjFanin0(pObj)) )
                Abc_NtkTraverseSupersAnd_rec( p, Abc_ObjFanin0(pObj), vInputs );
    }
    else
    {
        Abc_NtkForEachCo( p->pNtk, pObj, i )
            if ( Abc_ObjIsNode(Abc_ObjFanin0(pObj)) )
                Abc_NtkTraverseSupersXor_rec( p, Abc_ObjFanin0(pObj), vInputs );
    }
    p->nStartCols = Vec_IntSize(p->vObj2Lit);

    // find the largest number of 1s
    nOnesMax = 0;
    Vec_PtrForEachEntry( Vec_Int_t *, vInputs, vInput, i )
        if ( vInput )
            nOnesMax = Abc_MaxInt( nOnesMax, Vec_IntSize(vInput)-SHARE_NUM );

    // create buckets
    assert( p->vBuckets == NULL );
    p->vBuckets = Vec_PtrAlloc( nOnesMax + 1 );
    for ( i = 0; i <= nOnesMax; i++ )
        Vec_PtrPush( p->vBuckets, Vec_PtrAlloc(10) );

    // load vectors into buckets
    Vec_PtrForEachEntry( Vec_Int_t *, vInputs, vInput, i )
        if ( vInput )
            Vec_PtrPush( (Vec_Ptr_t *)Vec_PtrEntry(p->vBuckets, Vec_IntSize(vInput)-SHARE_NUM), vInput );
    Vec_PtrFree( vInputs );
}